

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar10;
  pointer pcVar11;
  double dVar12;
  pointer pMVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  undefined8 uVar17;
  Interval *pIVar18;
  IVal *value;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  float *value_00;
  undefined1 *puVar21;
  int row;
  long lVar22;
  TestStatus *pTVar23;
  long lVar24;
  _Base_ptr p_Var25;
  long lVar26;
  IVal in2;
  IVal reference1;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  FuncSet funcs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff9c8;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  *pBVar27;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  *pBVar28;
  string local_630;
  IVal local_609;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_608;
  size_t local_600;
  ulong local_5f8;
  FloatFormat *local_5f0;
  TestStatus *local_5e8;
  string local_5e0;
  long local_5c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5b8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  local_588;
  FloatFormat local_558;
  undefined1 local_528 [12];
  float fStack_51c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  double local_508;
  float local_500;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_4f8;
  undefined4 local_4f0;
  ios_base local_4b8 [8];
  ios_base local_4b0 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_398;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Rb_tree_node_base *local_318;
  double local_310;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_5e8 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_5f0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,3>,tcu::Matrix<float,4,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_398,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffff9c8);
  pMVar13 = local_398.in0.
            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_600 = ((long)local_398.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_398.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_588,local_600);
  local_558.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_558.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_558.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_558.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_558.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_558.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_558.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_558.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_558._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5b8._M_impl.super__Rb_tree_header._M_header;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_608 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_398.in0.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_398.in1.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_398.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_398.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3a8._M_allocated_capacity =
       (size_type)
       local_588.out0.
       super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3a8._8_8_ =
       local_588.out1.
       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
       _M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_528 + 8);
  local_528._0_8_ = local_608;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_4b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
  p_Var5 = (_Rb_tree_node_base *)(local_338 + 8);
  local_338._8_4_ = _S_red;
  local_328._M_allocated_capacity = 0;
  local_310 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_328._8_8_ = p_Var5;
  local_318 = p_Var5;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_338);
  if ((_Rb_tree_node_base *)local_328._8_8_ != p_Var5) {
    uVar17 = local_328._8_8_;
    do {
      (**(code **)(**(long **)(uVar17 + 0x20) + 0x30))(*(long **)(uVar17 + 0x20),&local_1a8);
      uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17);
    } while ((_Rb_tree_node_base *)uVar17 != p_Var5);
  }
  if (local_310 != 0.0) {
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_608;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,local_630._M_dataplus._M_p,local_630._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
  std::ios_base::~ios_base((ios_base *)local_138[0]._M_local_buf);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  paVar20 = &local_3a8;
  pBVar27 = this;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_600,&local_218,paVar20,0);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_528);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)&local_1a8);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_338);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_528);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)&local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_630);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5e0);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_338);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_609);
  if (local_398.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
LAB_00925ab7:
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_608;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar23 = local_5e8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"Pass","");
    pTVar23->m_code = QP_TEST_RESULT_PASS;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_528._0_8_,
               (char *)(local_528._0_8_ + CONCAT44(fStack_51c,local_528._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ == &local_518) goto LAB_00925ca2;
    uVar17 = (_Base_ptr)
             CONCAT44(local_518._M_allocated_capacity._4_4_,local_518._M_allocated_capacity._0_4_);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._0_8_;
  }
  else {
    poVar4 = (ostringstream *)(local_528 + 8);
    local_5c0 = local_600 + (local_600 == 0);
    lVar26 = 0;
    local_5f8 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)&local_1a8);
      pFVar1 = local_5f0;
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_338,(shaderexecutor *)local_5f0,
                 (FloatFormat *)
                 (local_398.in0.
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar26),(Matrix<float,_4,_3> *)paVar20
                );
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_528,pFVar1,(IVal *)local_338);
      pIVar18 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_5b8,
                           (pBVar27->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      pFVar1 = local_5f0;
      value_00 = (float *)local_528;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar18->m_hi + lVar24) =
               *(undefined8 *)
                ((long)(((Matrix<float,_4,_3> *)value_00)->m_data).m_data[1].m_data + lVar24);
          puVar19 = (undefined8 *)
                    ((long)(((Matrix<float,_4,_3> *)value_00)->m_data).m_data[0].m_data + lVar24);
          dVar12 = (double)puVar19[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar18->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar2 = *puVar19;
          *(double *)(pbVar2 + 8) = dVar12;
          lVar24 = lVar24 + 0x60;
        } while (lVar24 != 0x120);
        lVar22 = lVar22 + 1;
        pIVar18 = pIVar18 + 1;
        value_00 = (((Matrix<float,_4,_3> *)value_00)->m_data).m_data[1].m_data + 2;
      } while (lVar22 != 4);
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_338,(shaderexecutor *)local_5f0,
                 (FloatFormat *)
                 (local_398.in1.
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar26),
                 (Matrix<float,_4,_3> *)value_00);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_528,pFVar1,(IVal *)local_338);
      pIVar18 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_5b8,
                           (pBVar27->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      puVar21 = local_528;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar18->m_hi + lVar24) = *(undefined8 *)(puVar21 + lVar24 + 0x10);
          dVar12 = *(double *)((long)(puVar21 + lVar24) + 8);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar18->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar21 + lVar24);
          *(double *)(pbVar2 + 8) = dVar12;
          lVar24 = lVar24 + 0x60;
        } while (lVar24 != 0x120);
        lVar22 = lVar22 + 1;
        pIVar18 = pIVar18 + 1;
        puVar21 = puVar21 + 0x18;
      } while (lVar22 != 4);
      pBVar28 = pBVar27;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (pBVar27->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (pBVar27->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_500 = (float)(pBVar27->m_caseCtx).precision;
      local_508 = local_5f0->m_maxValue;
      local_528._0_8_ = *(undefined8 *)local_5f0;
      local_528._8_4_ = local_5f0->m_fractionBits;
      fStack_51c = (float)local_5f0->m_hasSubnormal;
      local_518._M_allocated_capacity._0_4_ = local_5f0->m_hasInf;
      local_518._M_allocated_capacity._4_4_ = local_5f0->m_hasNaN;
      local_518._8_4_ = *(undefined4 *)&local_5f0->m_exactPrecision;
      local_518._12_4_ = *(undefined4 *)&local_5f0->field_0x1c;
      local_4f0 = 0;
      pSVar8 = (pBVar27->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_4f8 = &local_5b8;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_528);
      value = Environment::lookup<tcu::Matrix<float,4,3>>
                        ((Environment *)&local_5b8,
                         (pBVar27->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                         .m_ptr);
      pIVar18 = (Interval *)local_528;
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)pIVar18,&local_558,value);
      paVar20 = &local_1a8;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)paVar20 + lVar24 + 0x10) =
               *(undefined8 *)((long)&pIVar18->m_hi + lVar24);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar18->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          dVar12 = *(double *)(pbVar2 + 8);
          *(undefined8 *)((long)paVar20 + lVar24) = *(undefined8 *)pbVar2;
          ((undefined8 *)((long)paVar20 + lVar24))[1] = dVar12;
          lVar24 = lVar24 + 0x60;
        } while (lVar24 != 0x120);
        lVar22 = lVar22 + 1;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar20 + 0x18);
        pIVar18 = pIVar18 + 1;
      } while (lVar22 != 4);
      bVar14 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)&local_1a8,
                          local_588.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar26);
      local_528._0_8_ = &local_518;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_528,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_528);
      pBVar27 = pBVar28;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT44(local_518._M_allocated_capacity._4_4_,
                                 local_518._M_allocated_capacity._0_4_) + 1);
        pBVar27 = pBVar28;
      }
      if ((!bVar14) && (uVar16 = (int)local_5f8 + 1, local_5f8 = (ulong)uVar16, (int)uVar16 < 0x65))
      {
        local_528._0_8_ = local_608;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar27->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        paVar20 = &local_328;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_338._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_630,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   (local_398.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar26),
                   (Matrix<float,_4,_3> *)paVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._0_8_ != &local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_328._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar27->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        paVar20 = &local_328;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_338._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_630,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   (local_398.in1.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar26),
                   (Matrix<float,_4,_3> *)paVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._0_8_ != &local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_328._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar27->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        paVar20 = &local_328;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_338._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_630,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   (local_588.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar26),
                   (Matrix<float,_4,_3> *)paVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_630._M_dataplus._M_p,local_630._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,3>>
                  (&local_5e0,(shaderexecutor *)&local_558,(FloatFormat *)&local_1a8,(IVal *)paVar20
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._M_dataplus._M_p != &local_630.field_2) {
          operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._0_8_ != &local_328) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_328._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_4b0);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != local_5c0);
    iVar15 = (int)local_5f8;
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_00925ab7;
    }
    else {
      poVar4 = (ostringstream *)(local_528 + 8);
      local_528._0_8_ = local_608;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_4b0);
    }
    poVar4 = (ostringstream *)(local_528 + 8);
    local_528._0_8_ = local_608;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_4b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    std::ostream::operator<<(local_528,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    std::ios_base::~ios_base(local_4b8);
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528," test failed. Check log for the details","");
    pTVar23 = local_5e8;
    p_Var3 = (_Base_ptr)
             (CONCAT44(fStack_51c,local_528._8_4_) + CONCAT44(local_338._12_4_,local_338._8_4_));
    uVar17 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._0_8_ != &local_328) {
      uVar17 = local_328._M_allocated_capacity;
    }
    if ((ulong)uVar17 < p_Var3) {
      p_Var25 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        p_Var25 = (_Base_ptr)
                  CONCAT44(local_518._M_allocated_capacity._4_4_,
                           local_518._M_allocated_capacity._0_4_);
      }
      if (p_Var25 < p_Var3) goto LAB_00925aa5;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_528,0,(char *)0x0,local_338._0_8_);
    }
    else {
LAB_00925aa5:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_338,local_528._0_8_);
    }
    local_1a8._M_allocated_capacity = (size_type)local_198;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar19 == paVar20) {
      local_198[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_198[0]._8_4_ = *(undefined4 *)(puVar19 + 3);
      local_198[0]._12_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_198[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_1a8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar19;
    }
    local_1a8._8_8_ = puVar19[1];
    *puVar19 = paVar20;
    puVar19[1] = 0;
    paVar20->_M_local_buf[0] = '\0';
    pTVar23->m_code = QP_TEST_RESULT_FAIL;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_1a8._M_allocated_capacity,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._M_allocated_capacity));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,
                      CONCAT44(local_518._M_allocated_capacity._4_4_,
                               local_518._M_allocated_capacity._0_4_) + 1);
    }
    uVar17 = local_328._M_allocated_capacity;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._0_8_ == &local_328) goto LAB_00925ca2;
  }
  operator_delete(paVar20,(ulong)((long)&((_Base_ptr)uVar17)->_M_color + 1));
LAB_00925ca2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5b8);
  if (local_588.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.out0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.in1.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.in1.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar23;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}